

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O0

int ecp_select_comb(mbedtls_ecp_group *grp,mbedtls_ecp_point *R,mbedtls_ecp_point *T,uchar T_size,
                   uchar i)

{
  byte bVar1;
  int iVar2;
  byte local_2a;
  uchar j;
  uchar ii;
  int ret;
  uchar i_local;
  uchar T_size_local;
  mbedtls_ecp_point *T_local;
  mbedtls_ecp_point *R_local;
  mbedtls_ecp_group *grp_local;
  
  bVar1 = (byte)((i & 0x7f) >> 1);
  local_2a = 0;
  while( true ) {
    if (T_size <= local_2a) {
      iVar2 = ecp_safe_invert_jac(grp,R,(uchar)((int)(uint)i >> 7));
      return iVar2;
    }
    iVar2 = mbedtls_mpi_safe_cond_assign(&R->X,&T[local_2a].X,local_2a == bVar1);
    if (iVar2 != 0) break;
    iVar2 = mbedtls_mpi_safe_cond_assign(&R->Y,&T[local_2a].Y,local_2a == bVar1);
    if (iVar2 != 0) {
      return iVar2;
    }
    local_2a = local_2a + 1;
  }
  return iVar2;
}

Assistant:

static int ecp_select_comb( const mbedtls_ecp_group *grp, mbedtls_ecp_point *R,
                            const mbedtls_ecp_point T[], unsigned char T_size,
                            unsigned char i )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    unsigned char ii, j;

    /* Ignore the "sign" bit and scale down */
    ii =  ( i & 0x7Fu ) >> 1;

    /* Read the whole table to thwart cache-based timing attacks */
    for( j = 0; j < T_size; j++ )
    {
        MBEDTLS_MPI_CHK( mbedtls_mpi_safe_cond_assign( &R->X, &T[j].X, j == ii ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_safe_cond_assign( &R->Y, &T[j].Y, j == ii ) );
    }

    /* Safely invert result if i is "negative" */
    MBEDTLS_MPI_CHK( ecp_safe_invert_jac( grp, R, i >> 7 ) );

cleanup:
    return( ret );
}